

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O3

void __thiscall
soplex::SPxLPBase<double>::changeRowObj
          (SPxLPBase<double> *this,VectorBase<double> *newRowObj,bool scale)

{
  pointer pdVar1;
  uint uVar2;
  ulong uVar3;
  
  VectorBase<double>::operator=(&(this->super_LPRowSetBase<double>).object,newRowObj);
  if (this->thesense == MINIMIZE) {
    pdVar1 = (this->super_LPRowSetBase<double>).object.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    uVar2 = (uint)((ulong)((long)(this->super_LPRowSetBase<double>).object.val.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_finish - (long)pdVar1) >> 3);
    if (0 < (int)uVar2) {
      uVar3 = 0;
      do {
        pdVar1[uVar3] = -pdVar1[uVar3];
        uVar3 = uVar3 + 1;
      } while ((uVar2 & 0x7fffffff) != uVar3);
    }
  }
  return;
}

Assistant:

virtual void changeRowObj(const VectorBase<R>& newRowObj, bool scale = false)
   {
      assert(maxRowObj().dim() == newRowObj.dim());
      LPRowSetBase<R>::obj_w() = newRowObj;

      if(spxSense() == MINIMIZE)
         LPRowSetBase<R>::obj_w() *= -1;

      assert(isConsistent());
   }